

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int add_arg(JSContext *ctx,JSFunctionDef *fd,JSAtom name)

{
  long lVar1;
  int iVar2;
  JSAtom JVar3;
  JSAtom *__s;
  undefined4 in_EDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  JSVarDef *vd;
  undefined1 in_stack_ffffffffffffffc8 [16];
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if (*(int *)((long)&in_RSI->native_error_proto[1].u + 4) < 0x10000) {
    iVar2 = js_resize_array(in_RSI,(void **)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                            (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                            in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._4_4_);
    if (iVar2 == 0) {
      lVar1 = in_RSI->native_error_proto[0].tag;
      iVar2 = *(int *)((long)&in_RSI->native_error_proto[1].u + 4);
      *(int *)((long)&in_RSI->native_error_proto[1].u + 4) = iVar2 + 1;
      __s = (JSAtom *)(lVar1 + (long)iVar2 * 0x10);
      memset(__s,0,0x10);
      JVar3 = JS_DupAtom((JSContext *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                         (JSAtom)((ulong)__s >> 0x20));
      *__s = JVar3;
      __s[3] = __s[3] & 0x8000007f | 0x7fffff80;
      local_4 = *(int *)((long)&in_RSI->native_error_proto[1].u + 4) + -1;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    JS_ThrowInternalError(in_RDI,"too many arguments");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int add_arg(JSContext *ctx, JSFunctionDef *fd, JSAtom name)
{
    JSVarDef *vd;

    /* the local variable indexes are currently stored on 16 bits */
    if (fd->arg_count >= JS_MAX_LOCAL_VARS) {
        JS_ThrowInternalError(ctx, "too many arguments");
        return -1;
    }
    if (js_resize_array(ctx, (void **)&fd->args, sizeof(fd->args[0]),
                        &fd->arg_size, fd->arg_count + 1))
        return -1;
    vd = &fd->args[fd->arg_count++];
    memset(vd, 0, sizeof(*vd));
    vd->var_name = JS_DupAtom(ctx, name);
    vd->func_pool_idx = -1;
    return fd->arg_count - 1;
}